

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void __thiscall
pdqsort_detail::
pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3,false>
          (pdqsort_detail *this,
          __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
          begin,__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                end,anon_class_16_2_405d1b53 comp,int bad_allowed,bool leftmost)

{
  double dVar1;
  undefined8 uVar2;
  double *pdVar3;
  bool bVar4;
  long lVar5;
  pair<int,_double> *ppVar6;
  ulong uVar7;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  _Var8;
  long lVar9;
  pair<int,_double> *ppVar10;
  long lVar11;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  _Var12;
  long lVar13;
  double *pdVar14;
  int __tmp;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  int __tmp_9;
  ulong uVar19;
  pair<int,_double> *ppVar20;
  pair<int,_double> *ppVar21;
  pair<int,_double> *ppVar22;
  double *pdVar23;
  int __tmp_2;
  int iVar24;
  uint uVar25;
  long lVar26;
  double dVar27;
  double dVar28;
  anon_class_16_2_405d1b53 comp_00;
  pair<int,_double> __value;
  pair<int,_double> __value_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:752:13)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:752:13)>
  __comp_00;
  double local_78;
  int local_64;
  
  comp_00.getFixVal = (HighsLpRelaxation *)comp.getFixVal;
  local_64 = (int)comp.heurlp;
  lVar5 = (long)begin._M_current - (long)this;
  uVar7 = lVar5 >> 4;
  if ((long)uVar7 < 0x18) {
    if ((char)bad_allowed == '\0') {
LAB_002db9c9:
      if ((pair<int,_double> *)((long)this + 0x10) == begin._M_current ||
          (pair<int,_double> *)this == begin._M_current) {
        return;
      }
      pdVar14 = &((pair<int,_double> *)((long)this + 0x10))->second;
      ppVar22 = (pair<int,_double> *)((long)this + 0x10);
      do {
        ppVar6 = ppVar22;
        uVar17 = ((pair<int,_double> *)((long)this + 0x10))->first;
        dVar1 = ((pair<int,_double> *)((long)this + 0x10))->second;
        iVar24 = ((pair<int,_double> *)this)->first;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar17
                          );
        pdVar3 = pdVar14;
        if (bVar4) {
          do {
            pdVar23 = pdVar3;
            ((pair<int,_double> *)(pdVar23 + -1))->first = iVar24;
            *pdVar23 = pdVar23[-2];
            iVar24 = *(int *)(pdVar23 + -5);
            bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                              ((anon_class_16_2_405d1b53 *)end._M_current,
                               (pair<int,_double> *)comp_00.getFixVal,
                               (pair<int,_double> *)(ulong)uVar17);
            pdVar3 = pdVar23 + -2;
          } while (bVar4);
          *(uint *)(pdVar23 + -3) = uVar17;
          pdVar23[-2] = dVar1;
        }
        ppVar22 = ppVar6 + 1;
        pdVar14 = pdVar14 + 2;
        this = (pdqsort_detail *)ppVar6;
      } while (ppVar22 != begin._M_current);
      return;
    }
  }
  else {
    do {
      uVar19 = uVar7 >> 1;
      ppVar22 = (pair<int,_double> *)((long)this + uVar19 * 0x10);
      if (uVar7 < 0x81) {
        uVar15 = ((pair<int,_double> *)this)->first;
        dVar27 = ((pair<int,_double> *)this)->second;
        uVar17 = ppVar22->first;
        dVar1 = ppVar22->second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar15
                          );
        if (bVar4) {
          ppVar22->first = uVar15;
          ((pair<int,_double> *)this)->first = uVar17;
          ppVar22->second = dVar27;
          ((pair<int,_double> *)this)->second = dVar1;
          dVar27 = dVar1;
          uVar15 = uVar17;
        }
        uVar17 = begin._M_current[-1].first;
        dVar1 = begin._M_current[-1].second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar17
                          );
        if (bVar4) {
          ((pair<int,_double> *)this)->first = uVar17;
          begin._M_current[-1].first = uVar15;
          ((pair<int,_double> *)this)->second = dVar1;
          begin._M_current[-1].second = dVar27;
          uVar15 = ((pair<int,_double> *)this)->first;
          dVar27 = ((pair<int,_double> *)this)->second;
        }
        uVar17 = ppVar22->first;
        dVar1 = ppVar22->second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar15
                          );
        if (bVar4) {
          ppVar22->first = uVar15;
          ((pair<int,_double> *)this)->first = uVar17;
          ppVar22->second = dVar27;
          ((pair<int,_double> *)this)->second = dVar1;
          uVar15 = uVar17;
        }
      }
      else {
        uVar15 = ppVar22->first;
        dVar27 = ppVar22->second;
        uVar17 = ((pair<int,_double> *)this)->first;
        dVar1 = ((pair<int,_double> *)this)->second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar15
                          );
        if (bVar4) {
          ((pair<int,_double> *)this)->first = uVar15;
          ppVar22->first = uVar17;
          ((pair<int,_double> *)this)->second = dVar27;
          ppVar22->second = dVar1;
          dVar27 = dVar1;
          uVar15 = uVar17;
        }
        uVar17 = begin._M_current[-1].first;
        dVar1 = begin._M_current[-1].second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar17
                          );
        if (bVar4) {
          ppVar22->first = uVar17;
          begin._M_current[-1].first = uVar15;
          ppVar22->second = dVar1;
          begin._M_current[-1].second = dVar27;
          uVar15 = ppVar22->first;
          dVar27 = ppVar22->second;
        }
        iVar24 = ((pair<int,_double> *)this)->first;
        dVar1 = ((pair<int,_double> *)this)->second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar15
                          );
        if (bVar4) {
          ((pair<int,_double> *)this)->first = uVar15;
          ppVar22->first = iVar24;
          ((pair<int,_double> *)this)->second = dVar27;
          ppVar22->second = dVar1;
        }
        ppVar6 = (pair<int,_double> *)((long)this + (uVar19 - 1) * 0x10);
        uVar15 = ppVar6->first;
        dVar27 = ((pair<int,_double> *)((long)this + (uVar19 - 1) * 0x10))->second;
        uVar17 = ((pair<int,_double> *)((long)this + 0x10))->first;
        dVar1 = ((pair<int,_double> *)((long)this + 0x10))->second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar15
                          );
        if (bVar4) {
          ((pair<int,_double> *)((long)this + 0x10))->first = uVar15;
          ppVar6->first = uVar17;
          ((pair<int,_double> *)((long)this + 0x10))->second = dVar27;
          ((pair<int,_double> *)((long)this + (uVar19 - 1) * 0x10))->second = dVar1;
          dVar27 = dVar1;
          uVar15 = uVar17;
        }
        uVar17 = begin._M_current[-2].first;
        dVar1 = begin._M_current[-2].second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar17
                          );
        if (bVar4) {
          ppVar6->first = uVar17;
          begin._M_current[-2].first = uVar15;
          ((pair<int,_double> *)((long)this + (uVar19 - 1) * 0x10))->second = dVar1;
          begin._M_current[-2].second = dVar27;
          uVar15 = ppVar6->first;
          dVar27 = ((pair<int,_double> *)((long)this + (uVar19 - 1) * 0x10))->second;
        }
        iVar24 = ((pair<int,_double> *)((long)this + 0x10))->first;
        dVar1 = ((pair<int,_double> *)((long)this + 0x10))->second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar15
                          );
        if (bVar4) {
          ((pair<int,_double> *)((long)this + 0x10))->first = uVar15;
          ppVar6->first = iVar24;
          ((pair<int,_double> *)((long)this + 0x10))->second = dVar27;
          ((pair<int,_double> *)((long)this + (uVar19 - 1) * 0x10))->second = dVar1;
        }
        ppVar21 = (pair<int,_double> *)((long)this + (uVar19 + 1) * 0x10);
        uVar15 = ppVar21->first;
        dVar27 = ((pair<int,_double> *)((long)this + (uVar19 + 1) * 0x10))->second;
        uVar17 = ((pair<int,_double> *)((long)this + 0x20))->first;
        dVar1 = ((pair<int,_double> *)((long)this + 0x20))->second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar15
                          );
        if (bVar4) {
          ((pair<int,_double> *)((long)this + 0x20))->first = uVar15;
          ppVar21->first = uVar17;
          ((pair<int,_double> *)((long)this + 0x20))->second = dVar27;
          ((pair<int,_double> *)((long)this + (uVar19 + 1) * 0x10))->second = dVar1;
          dVar27 = dVar1;
          uVar15 = uVar17;
        }
        uVar17 = begin._M_current[-3].first;
        dVar1 = begin._M_current[-3].second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar17
                          );
        if (bVar4) {
          ppVar21->first = uVar17;
          begin._M_current[-3].first = uVar15;
          ((pair<int,_double> *)((long)this + (uVar19 + 1) * 0x10))->second = dVar1;
          begin._M_current[-3].second = dVar27;
          uVar15 = ppVar21->first;
          dVar27 = ((pair<int,_double> *)((long)this + (uVar19 + 1) * 0x10))->second;
        }
        uVar17 = ((pair<int,_double> *)((long)this + 0x20))->first;
        dVar1 = ((pair<int,_double> *)((long)this + 0x20))->second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar15
                          );
        if (bVar4) {
          ((pair<int,_double> *)((long)this + 0x20))->first = uVar15;
          ppVar21->first = uVar17;
          ((pair<int,_double> *)((long)this + 0x20))->second = dVar27;
          ((pair<int,_double> *)((long)this + (uVar19 + 1) * 0x10))->second = dVar1;
          uVar15 = uVar17;
          dVar27 = dVar1;
        }
        uVar17 = ppVar22->first;
        dVar1 = ppVar22->second;
        uVar25 = ppVar6->first;
        local_78 = ((pair<int,_double> *)((long)this + (uVar19 - 1) * 0x10))->second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar17
                          );
        dVar28 = dVar1;
        uVar16 = uVar17;
        if (bVar4) {
          ppVar6->first = uVar17;
          ppVar22->first = uVar25;
          ((pair<int,_double> *)((long)this + (uVar19 - 1) * 0x10))->second = dVar1;
          ppVar22->second = local_78;
          dVar28 = local_78;
          uVar16 = uVar25;
          uVar25 = uVar17;
          local_78 = dVar1;
        }
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar15
                          );
        if (bVar4) {
          ppVar22->first = uVar15;
          ppVar21->first = uVar16;
          ppVar22->second = dVar27;
          ((pair<int,_double> *)((long)this + (uVar19 + 1) * 0x10))->second = dVar28;
          dVar28 = dVar27;
          uVar16 = uVar15;
        }
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar16
                          );
        if (bVar4) {
          ppVar6->first = uVar16;
          ppVar22->first = uVar25;
          ((pair<int,_double> *)((long)this + (uVar19 - 1) * 0x10))->second = dVar28;
          ppVar22->second = local_78;
          dVar28 = local_78;
          uVar16 = uVar25;
        }
        iVar24 = ((pair<int,_double> *)this)->first;
        ((pair<int,_double> *)this)->first = uVar16;
        ppVar22->first = iVar24;
        dVar1 = ((pair<int,_double> *)this)->second;
        ((pair<int,_double> *)this)->second = dVar28;
        ppVar22->second = dVar1;
        uVar15 = ((pair<int,_double> *)this)->first;
      }
      if ((bad_allowed & 1U) == 0) {
        ppVar22 = (pair<int,_double> *)((pair<int,_double> *)this)->second;
        bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                          ((anon_class_16_2_405d1b53 *)end._M_current,
                           (pair<int,_double> *)comp_00.getFixVal,
                           (pair<int,_double> *)
                           (ulong)(uint)((pair<int,_double> *)((long)this + -0x10))->first);
        if (bVar4) goto LAB_002db0f8;
        lVar5 = 0;
        do {
          lVar11 = lVar5;
          iVar24 = *(int *)((long)&begin._M_current[-1].first + lVar11);
          bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                            ((anon_class_16_2_405d1b53 *)end._M_current,
                             (pair<int,_double> *)comp_00.getFixVal,
                             (pair<int,_double> *)(ulong)uVar15);
          lVar5 = lVar11 + -0x10;
        } while (bVar4);
        ppVar6 = (pair<int,_double> *)((long)&begin._M_current[-1].first + lVar11);
        _Var8._M_current = (pair<int,_double> *)this;
        if (lVar11 + -0x10 == -0x10) {
          _Var12._M_current = (pair<int,_double> *)this;
          uVar17 = uVar15;
          if (this < ppVar6) {
            do {
              _Var12._M_current = _Var12._M_current + 1;
              uVar17 = (_Var12._M_current)->first;
              bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                ((anon_class_16_2_405d1b53 *)end._M_current,
                                 (pair<int,_double> *)comp_00.getFixVal,
                                 (pair<int,_double> *)(ulong)uVar15);
              if (ppVar6 <= _Var12._M_current) break;
            } while (!bVar4);
          }
        }
        else {
          do {
            _Var12._M_current = _Var8._M_current + 1;
            uVar17 = _Var8._M_current[1].first;
            bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                              ((anon_class_16_2_405d1b53 *)end._M_current,
                               (pair<int,_double> *)comp_00.getFixVal,
                               (pair<int,_double> *)(ulong)uVar15);
            _Var8._M_current = _Var12._M_current;
          } while (!bVar4);
        }
        if (_Var12._M_current < ppVar6) {
          do {
            (_Var12._M_current)->first = iVar24;
            ppVar6->first = uVar17;
            dVar1 = (_Var12._M_current)->second;
            (_Var12._M_current)->second = ppVar6->second;
            ppVar6->second = dVar1;
            do {
              iVar24 = ppVar6[-1].first;
              ppVar6 = ppVar6 + -1;
              bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                ((anon_class_16_2_405d1b53 *)end._M_current,
                                 (pair<int,_double> *)comp_00.getFixVal,
                                 (pair<int,_double> *)(ulong)uVar15);
            } while (bVar4);
            do {
              uVar17 = _Var12._M_current[1].first;
              _Var12._M_current = _Var12._M_current + 1;
              bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                ((anon_class_16_2_405d1b53 *)end._M_current,
                                 (pair<int,_double> *)comp_00.getFixVal,
                                 (pair<int,_double> *)(ulong)uVar15);
            } while (!bVar4);
          } while (_Var12._M_current < ppVar6);
        }
        ((pair<int,_double> *)this)->first = iVar24;
        ((pair<int,_double> *)this)->second = ppVar6->second;
        ppVar6->first = uVar15;
        ppVar6->second = (double)ppVar22;
        this = (pdqsort_detail *)(ppVar6 + 1);
        lVar11 = (long)begin._M_current - (long)this;
        uVar7 = lVar11 >> 4;
      }
      else {
        ppVar22 = (pair<int,_double> *)((pair<int,_double> *)this)->second;
LAB_002db0f8:
        lVar13 = 0;
        do {
          lVar11 = lVar13;
          uVar17 = *(uint *)((long)&((pair<int,_double> *)((long)this + 0x10))->first + lVar11);
          lVar13 = lVar11 + 0x10;
          bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                            ((anon_class_16_2_405d1b53 *)end._M_current,
                             (pair<int,_double> *)comp_00.getFixVal,
                             (pair<int,_double> *)(ulong)uVar17);
        } while (bVar4);
        ppVar6 = (pair<int,_double> *)
                 ((long)&((pair<int,_double> *)((long)this + 0x10))->first + lVar11);
        _Var8._M_current = begin._M_current;
        if (lVar13 == 0x10) {
          do {
            ppVar21 = _Var8._M_current;
            if (_Var8._M_current <= ppVar6) break;
            ppVar21 = _Var8._M_current + -1;
            bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                              ((anon_class_16_2_405d1b53 *)end._M_current,
                               (pair<int,_double> *)comp_00.getFixVal,
                               (pair<int,_double> *)(ulong)(uint)_Var8._M_current[-1].first);
            _Var8._M_current = ppVar21;
          } while (!bVar4);
        }
        else {
          do {
            ppVar21 = _Var8._M_current + -1;
            bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                              ((anon_class_16_2_405d1b53 *)end._M_current,
                               (pair<int,_double> *)comp_00.getFixVal,
                               (pair<int,_double> *)(ulong)(uint)_Var8._M_current[-1].first);
            _Var8._M_current = ppVar21;
          } while (!bVar4);
        }
        if (ppVar6 < ppVar21) {
          uVar25 = ppVar21->first;
          ppVar20 = ppVar21;
          do {
            *(uint *)((long)&((pair<int,_double> *)this)->first + lVar13) = uVar25;
            ppVar20->first = uVar17;
            dVar1 = *(double *)((long)&((pair<int,_double> *)this)->second + lVar13);
            *(double *)((long)&((pair<int,_double> *)this)->second + lVar13) = ppVar20->second;
            ppVar20->second = dVar1;
            do {
              lVar11 = lVar13;
              uVar17 = *(uint *)((long)&((pair<int,_double> *)((long)this + 0x10))->first + lVar11);
              lVar13 = lVar11 + 0x10;
              bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                ((anon_class_16_2_405d1b53 *)end._M_current,
                                 (pair<int,_double> *)comp_00.getFixVal,
                                 (pair<int,_double> *)(ulong)uVar17);
            } while (bVar4);
            do {
              uVar25 = ppVar20[-1].first;
              ppVar20 = ppVar20 + -1;
              bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                ((anon_class_16_2_405d1b53 *)end._M_current,
                                 (pair<int,_double> *)comp_00.getFixVal,
                                 (pair<int,_double> *)(ulong)uVar25);
            } while (!bVar4);
          } while ((pair<int,_double> *)
                   ((long)&((pair<int,_double> *)((long)this + 0x10))->first + lVar11) < ppVar20);
        }
        ppVar20 = (pair<int,_double> *)((long)&((pair<int,_double> *)this)->first + lVar13);
        _Var8._M_current =
             (pair<int,_double> *)
             ((long)&((pair<int,_double> *)((long)this + -0x10))->first + lVar13);
        ((pair<int,_double> *)this)->first = (_Var8._M_current)->first;
        ((pair<int,_double> *)this)->second = *(double *)((long)this + lVar13 + -8);
        (_Var8._M_current)->first = uVar15;
        *(pair<int,_double> **)((long)this + lVar13 + -8) = ppVar22;
        uVar19 = (long)_Var8._M_current - (long)this >> 4;
        lVar11 = (long)begin._M_current - (long)ppVar20;
        uVar18 = lVar11 >> 4;
        if (((long)uVar19 < (long)(uVar7 >> 3)) || ((long)uVar18 < (long)(uVar7 >> 3))) {
          local_64 = local_64 + -1;
          if (local_64 == 0) {
            uVar19 = uVar7 - 2 >> 1;
            pdVar14 = &((pair<int,_double> *)((long)this + uVar19 * 0x10))->second;
            do {
              __value._4_4_ = 0;
              __value.first = ((pair<int,_double> *)(pdVar14 + -1))->first;
              __value.second = *pdVar14;
              __comp._M_comp.heurlp = comp_00.getFixVal;
              __comp._M_comp.getFixVal = (anon_class_32_4_ffb23deb *)end._M_current;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,std::pair<int,double>,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>>
                        ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                          )this,uVar19,uVar7,__value,__comp);
              pdVar14 = pdVar14 + -2;
              bVar4 = uVar19 != 0;
              uVar19 = uVar19 - 1;
            } while (bVar4);
            if (lVar5 < 0x11) {
              return;
            }
            pdVar14 = &begin._M_current[-1].second;
            lVar5 = (long)begin._M_current - (long)this;
            do {
              __value_00._4_4_ = 0;
              __value_00.first = ((pair<int,_double> *)(pdVar14 + -1))->first;
              dVar1 = *pdVar14;
              ((pair<int,_double> *)(pdVar14 + -1))->first = ((pair<int,_double> *)this)->first;
              *pdVar14 = ((pair<int,_double> *)this)->second;
              lVar5 = lVar5 + -0x10;
              __value_00.second = dVar1;
              __comp_00._M_comp.heurlp = comp_00.getFixVal;
              __comp_00._M_comp.getFixVal = (anon_class_32_4_ffb23deb *)end._M_current;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,std::pair<int,double>,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3>>
                        ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                          )this,0,lVar5 >> 4,__value_00,__comp_00);
              pdVar14 = pdVar14 + -2;
            } while (0x10 < lVar5);
            return;
          }
          if (0x17 < (long)uVar19) {
            uVar7 = uVar19 >> 2;
            iVar24 = ((pair<int,_double> *)this)->first;
            ((pair<int,_double> *)this)->first =
                 ((pair<int,_double> *)((long)this + uVar7 * 0x10))->first;
            ((pair<int,_double> *)((long)this + uVar7 * 0x10))->first = iVar24;
            dVar1 = ((pair<int,_double> *)this)->second;
            ((pair<int,_double> *)this)->second =
                 ((pair<int,_double> *)((long)this + uVar7 * 0x10))->second;
            ((pair<int,_double> *)((long)this + uVar7 * 0x10))->second = dVar1;
            ppVar6 = _Var8._M_current + -uVar7;
            iVar24 = *(int *)((long)&((pair<int,_double> *)((long)this + -0x20))->first + lVar13);
            *(int *)((long)&((pair<int,_double> *)((long)this + -0x20))->first + lVar13) =
                 ppVar6->first;
            ppVar6->first = iVar24;
            dVar1 = *(double *)((long)this + lVar13 + -0x18);
            *(double *)((long)this + lVar13 + -0x18) = ppVar6->second;
            ppVar6->second = dVar1;
            if (0x80 < uVar19) {
              iVar24 = ((pair<int,_double> *)((long)this + 0x10))->first;
              ((pair<int,_double> *)((long)this + 0x10))->first =
                   ((pair<int,_double> *)((long)this + (uVar7 + 1) * 0x10))->first;
              ((pair<int,_double> *)((long)this + (uVar7 + 1) * 0x10))->first = iVar24;
              dVar1 = ((pair<int,_double> *)((long)this + 0x10))->second;
              ((pair<int,_double> *)((long)this + 0x10))->second =
                   ((pair<int,_double> *)((long)this + (uVar7 + 1) * 0x10))->second;
              ((pair<int,_double> *)((long)this + (uVar7 + 1) * 0x10))->second = dVar1;
              iVar24 = ((pair<int,_double> *)((long)this + 0x20))->first;
              ((pair<int,_double> *)((long)this + 0x20))->first =
                   ((pair<int,_double> *)((long)this + (uVar7 + 2) * 0x10))->first;
              ((pair<int,_double> *)((long)this + (uVar7 + 2) * 0x10))->first = iVar24;
              dVar1 = ((pair<int,_double> *)((long)this + 0x20))->second;
              ((pair<int,_double> *)((long)this + 0x20))->second =
                   ((pair<int,_double> *)((long)this + (uVar7 + 2) * 0x10))->second;
              ((pair<int,_double> *)((long)this + (uVar7 + 2) * 0x10))->second = dVar1;
              lVar5 = -2 - uVar7;
              uVar7 = ~uVar7;
              iVar24 = *(int *)((long)&((pair<int,_double> *)((long)this + -0x30))->first + lVar13);
              *(int *)((long)&((pair<int,_double> *)((long)this + -0x30))->first + lVar13) =
                   _Var8._M_current[uVar7].first;
              _Var8._M_current[uVar7].first = iVar24;
              uVar2 = *(undefined8 *)((long)this + lVar13 + -0x28);
              *(undefined8 *)((long)this + lVar13 + -0x28) =
                   *(undefined8 *)((long)this + uVar7 * 0x10 + lVar13 + -8);
              *(undefined8 *)((long)this + uVar7 * 0x10 + lVar13 + -8) = uVar2;
              iVar24 = *(int *)((long)&((pair<int,_double> *)((long)this + -0x40))->first + lVar13);
              *(int *)((long)&((pair<int,_double> *)((long)this + -0x40))->first + lVar13) =
                   _Var8._M_current[lVar5].first;
              _Var8._M_current[lVar5].first = iVar24;
              uVar2 = *(undefined8 *)((long)this + lVar13 + -0x38);
              *(undefined8 *)((long)this + lVar13 + -0x38) =
                   *(undefined8 *)((long)this + lVar5 * 0x10 + lVar13 + -8);
              *(undefined8 *)((long)this + lVar5 * 0x10 + lVar13 + -8) = uVar2;
            }
          }
          if (0x17 < (long)uVar18) {
            uVar7 = uVar18 >> 2;
            iVar24 = ppVar20->first;
            ppVar20->first =
                 *(int *)((long)&((pair<int,_double> *)((long)this + uVar7 * 0x10))->first + lVar13)
            ;
            *(int *)((long)&((pair<int,_double> *)((long)this + uVar7 * 0x10))->first + lVar13) =
                 iVar24;
            dVar1 = ppVar20->second;
            ppVar20->second =
                 *(double *)
                  ((long)&((pair<int,_double> *)((long)this + uVar7 * 0x10))->second + lVar13);
            *(double *)((long)&((pair<int,_double> *)((long)this + uVar7 * 0x10))->second + lVar13)
                 = dVar1;
            ppVar6 = begin._M_current + -uVar7;
            iVar24 = begin._M_current[-1].first;
            begin._M_current[-1].first = ppVar6->first;
            ppVar6->first = iVar24;
            dVar1 = begin._M_current[-1].second;
            begin._M_current[-1].second = ppVar6->second;
            ppVar6->second = dVar1;
            if (0x80 < uVar18) {
              iVar24 = *(int *)((long)&((pair<int,_double> *)((long)this + 0x10))->first + lVar13);
              *(int *)((long)&((pair<int,_double> *)((long)this + 0x10))->first + lVar13) =
                   _Var8._M_current[uVar7 + 2].first;
              _Var8._M_current[uVar7 + 2].first = iVar24;
              dVar1 = *(double *)
                       ((long)&((pair<int,_double> *)((long)this + 0x10))->second + lVar13);
              *(double *)((long)&((pair<int,_double> *)((long)this + 0x10))->second + lVar13) =
                   _Var8._M_current[uVar7 + 2].second;
              _Var8._M_current[uVar7 + 2].second = dVar1;
              iVar24 = *(int *)((long)&((pair<int,_double> *)((long)this + 0x20))->first + lVar13);
              *(int *)((long)&((pair<int,_double> *)((long)this + 0x20))->first + lVar13) =
                   _Var8._M_current[uVar7 + 3].first;
              _Var8._M_current[uVar7 + 3].first = iVar24;
              dVar1 = *(double *)
                       ((long)&((pair<int,_double> *)((long)this + 0x20))->second + lVar13);
              *(double *)((long)&((pair<int,_double> *)((long)this + 0x20))->second + lVar13) =
                   _Var8._M_current[uVar7 + 3].second;
              _Var8._M_current[uVar7 + 3].second = dVar1;
              lVar5 = -2 - uVar7;
              uVar7 = ~uVar7;
              iVar24 = begin._M_current[-2].first;
              begin._M_current[-2].first = begin._M_current[uVar7].first;
              begin._M_current[uVar7].first = iVar24;
              dVar1 = begin._M_current[-2].second;
              begin._M_current[-2].second = begin._M_current[uVar7].second;
              begin._M_current[uVar7].second = dVar1;
              iVar24 = begin._M_current[-3].first;
              begin._M_current[-3].first = begin._M_current[lVar5].first;
              begin._M_current[lVar5].first = iVar24;
              dVar1 = begin._M_current[-3].second;
              begin._M_current[-3].second = begin._M_current[lVar5].second;
              begin._M_current[lVar5].second = dVar1;
            }
          }
        }
        else if (ppVar21 <= ppVar6) {
          if ((lVar13 - 0x10U & 0xffffffffffffffef) != 0) {
            lVar5 = 0;
            local_78 = 0.0;
            ppVar22 = (pair<int,_double> *)((long)this + 0x10);
            _Var12._M_current = (pair<int,_double> *)this;
            do {
              ppVar6 = ppVar22;
              uVar17 = _Var12._M_current[1].first;
              dVar1 = _Var12._M_current[1].second;
              iVar24 = (_Var12._M_current)->first;
              ppVar22 = (pair<int,_double> *)(ulong)uVar17;
              bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                ((anon_class_16_2_405d1b53 *)end._M_current,
                                 (pair<int,_double> *)comp_00.getFixVal,
                                 (pair<int,_double> *)(ulong)uVar17);
              _Var12._M_current = ppVar6;
              lVar26 = lVar5;
              if (bVar4) {
                do {
                  ppVar21 = _Var12._M_current;
                  ppVar21->first = iVar24;
                  ppVar21->second = ppVar21[-1].second;
                  _Var12._M_current = (pair<int,_double> *)this;
                  if (lVar26 == 0) break;
                  _Var12._M_current = ppVar21 + -1;
                  iVar24 = ppVar21[-2].first;
                  bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                    ((anon_class_16_2_405d1b53 *)end._M_current,
                                     (pair<int,_double> *)comp_00.getFixVal,ppVar22);
                  lVar26 = lVar26 + 0x10;
                } while (bVar4);
                (_Var12._M_current)->first = uVar17;
                ppVar21[-1].second = dVar1;
                local_78 = (double)((long)local_78 + ((long)ppVar6 - (long)_Var12._M_current >> 4));
                if (8 < (ulong)local_78) goto LAB_002db97d;
              }
              lVar5 = lVar5 + -0x10;
              ppVar22 = ppVar6 + 1;
              _Var12._M_current = ppVar6;
            } while (ppVar6 + 1 != _Var8._M_current);
          }
          if (ppVar20 == begin._M_current) {
            return;
          }
          if (ppVar20 + 1 == begin._M_current) {
            return;
          }
          lVar5 = 0;
          uVar7 = 0;
          ppVar22 = ppVar20 + 1;
          ppVar6 = ppVar20;
          do {
            ppVar21 = ppVar22;
            uVar17 = ppVar6[1].first;
            ppVar22 = (pair<int,_double> *)ppVar6[1].second;
            iVar24 = ppVar6->first;
            bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                              ((anon_class_16_2_405d1b53 *)end._M_current,
                               (pair<int,_double> *)comp_00.getFixVal,
                               (pair<int,_double> *)(ulong)uVar17);
            lVar26 = lVar5;
            if (bVar4) {
              do {
                lVar9 = lVar26;
                *(int *)((long)&ppVar20[1].first + lVar9) = iVar24;
                *(undefined8 *)((long)&ppVar20[1].second + lVar9) =
                     *(undefined8 *)((long)&ppVar20->second + lVar9);
                ppVar6 = ppVar20;
                ppVar10 = ppVar20;
                if (lVar9 == 0) goto LAB_002db571;
                iVar24 = *(int *)((long)&ppVar20[-1].first + lVar9);
                bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                                  ((anon_class_16_2_405d1b53 *)end._M_current,
                                   (pair<int,_double> *)comp_00.getFixVal,
                                   (pair<int,_double> *)(ulong)uVar17);
                lVar26 = lVar9 + -0x10;
              } while (bVar4);
              ppVar6 = (pair<int,_double> *)
                       ((long)&((pair<int,_double> *)this)->first + lVar13 + lVar9);
              ppVar10 = (pair<int,_double> *)((long)&ppVar20->first + lVar9);
LAB_002db571:
              ppVar10->first = uVar17;
              *(pair<int,_double> **)((long)&ppVar20->second + lVar9) = ppVar22;
              uVar7 = uVar7 + ((long)ppVar21 - (long)ppVar6 >> 4);
              if (8 < uVar7) break;
            }
            lVar5 = lVar5 + 0x10;
            ppVar22 = ppVar21 + 1;
            ppVar6 = ppVar21;
            if (ppVar21 + 1 == begin._M_current) {
              return;
            }
          } while( true );
        }
LAB_002db97d:
        comp_00.heurlp._0_4_ = local_64;
        comp_00.heurlp._4_4_ = 0;
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3,false>
                  (this,_Var8,end,comp_00,bad_allowed & 1,SUB81(ppVar22,0));
        bad_allowed = 0;
        uVar7 = uVar18;
        this = (pdqsort_detail *)ppVar20;
      }
      lVar5 = lVar11;
    } while (0x17 < (long)uVar7);
    if ((bad_allowed & 1U) == 0) goto LAB_002db9c9;
  }
  if ((pair<int,_double> *)((long)this + 0x10) != begin._M_current &&
      (pair<int,_double> *)this != begin._M_current) {
    lVar5 = 0;
    ppVar22 = (pair<int,_double> *)((long)this + 0x10);
    ppVar6 = (pair<int,_double> *)this;
    do {
      ppVar21 = ppVar22;
      uVar17 = ppVar6[1].first;
      dVar1 = ppVar6[1].second;
      iVar24 = ppVar6->first;
      bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                        ((anon_class_16_2_405d1b53 *)end._M_current,
                         (pair<int,_double> *)comp_00.getFixVal,(pair<int,_double> *)(ulong)uVar17);
      lVar11 = lVar5;
      ppVar22 = ppVar21;
      if (bVar4) {
        do {
          ppVar6 = ppVar22;
          ppVar6->first = iVar24;
          ppVar6->second = ppVar6[-1].second;
          ppVar22 = (pair<int,_double> *)this;
          if (lVar11 == 0) break;
          ppVar22 = ppVar6 + -1;
          iVar24 = ppVar6[-2].first;
          bVar4 = HighsPrimalHeuristics::RINS::anon_class_16_2_405d1b53::operator()
                            ((anon_class_16_2_405d1b53 *)end._M_current,
                             (pair<int,_double> *)comp_00.getFixVal,
                             (pair<int,_double> *)(ulong)uVar17);
          lVar11 = lVar11 + 0x10;
        } while (bVar4);
        ppVar22->first = uVar17;
        ppVar6[-1].second = dVar1;
      }
      lVar5 = lVar5 + -0x10;
      ppVar22 = ppVar21 + 1;
      ppVar6 = ppVar21;
    } while (ppVar21 + 1 != begin._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }